

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O2

string * yactfr::internal::pseudoTypeIdenStr<yactfr::internal::PseudoDst>
                   (string *__return_storage_ptr__,PseudoDst *pseudoDst)

{
  ostream *poVar1;
  reference_const_type pbVar2;
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)&ss);
  if (((pseudoDst->_name).super_type.m_initialized != false) ||
     ((pseudoDst->_ns).super_type.m_initialized == true)) {
    std::operator<<((ostream *)&ss,'(');
    if ((pseudoDst->_name).super_type.m_initialized == true) {
      poVar1 = std::operator<<((ostream *)&ss,"named `");
      pbVar2 = boost::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get(&pseudoDst->_name);
      poVar1 = std::operator<<(poVar1,(string *)pbVar2);
      std::operator<<(poVar1,'`');
      if ((pseudoDst->_ns).super_type.m_initialized == true) {
        std::operator<<((ostream *)&ss,' ');
      }
    }
    if ((pseudoDst->_ns).super_type.m_initialized == true) {
      poVar1 = std::operator<<((ostream *)&ss,"within namespace `");
      pbVar2 = boost::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get(&pseudoDst->_ns);
      poVar1 = std::operator<<(poVar1,(string *)pbVar2);
      std::operator<<(poVar1,'`');
    }
    std::operator<<((ostream *)&ss,')');
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string pseudoTypeIdenStr(const PseudoTypeT& pseudoDst)
{
    std::ostringstream ss;

    ss << pseudoDst.id();

    if (pseudoDst.name() || pseudoDst.ns()) {
        ss << '(';

        if (pseudoDst.name()) {
            ss << "named `" << *pseudoDst.name() << '`';

            if (pseudoDst.ns()) {
                ss << ' ';
            }
        }

        if (pseudoDst.ns()) {
            ss << "within namespace `" << *pseudoDst.ns() << '`';
        }

        ss << ')';
    }

    return ss.str();
}